

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotPieChart<double>
               (char **label_ids,double *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  double dVar4;
  bool bVar5;
  ImU32 IVar6;
  ImDrawList *this;
  ImPlotItem *pIVar7;
  ulong uVar8;
  int i;
  int i_1;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float local_c8;
  float fStack_c4;
  float local_a8;
  float fStack_a4;
  ImPlotPoint center;
  ImVec2 local_60;
  char buffer [32];
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/implot/implot_items.cpp"
                  ,0x63c,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = double]"
                 );
  }
  this = GetPlotDrawList();
  uVar8 = 0;
  uVar9 = (ulong)(uint)count;
  if (count < 1) {
    uVar9 = uVar8;
  }
  dVar1 = 0.0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    dVar1 = dVar1 + values[uVar8];
  }
  center.x = x;
  center.y = y;
  PushPlotClipRect();
  dVar10 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
  dVar13 = dVar10;
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    dVar12 = values[uVar8];
    if (normalize || 1.0 < dVar1) {
      dVar12 = dVar12 / dVar1;
    }
    dVar11 = dVar12 * 6.2831854820251465 + dVar13;
    bVar5 = BeginItem(label_ids[uVar8],-1);
    if (bVar5) {
      IVar6 = ImGui::GetColorU32(&GImPlot->CurrentItem->Color);
      if (0.5 <= dVar12) {
        dVar12 = (dVar11 - dVar13) * 0.5 + dVar13;
        RenderPieSlice(this,&center,radius,dVar13,dVar12,IVar6);
        dVar13 = dVar12;
      }
      RenderPieSlice(this,&center,radius,dVar13,dVar11,IVar6);
      EndItem();
    }
    dVar13 = dVar11;
  }
  if (fmt != (char *)0x0) {
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      pIVar7 = GetItem(label_ids[uVar8]);
      dVar13 = values[uVar8];
      if (normalize || 1.0 < dVar1) {
        dVar13 = dVar13 / dVar1;
      }
      dVar13 = dVar13 * 6.2831854820251465 + dVar10;
      if (pIVar7->Show == true) {
        sprintf(buffer,fmt);
        IVar2 = ImGui::CalcTextSize(buffer,(char *)0x0,false,-1.0);
        dVar11 = center.x;
        dVar10 = (dVar13 - dVar10) * 0.5 + dVar10;
        dVar12 = cos(dVar10);
        dVar4 = center.y;
        dVar10 = sin(dVar10);
        IVar3 = PlotToPixels(dVar12 * radius * 0.5 + dVar11,dVar4 + dVar10 * radius * 0.5,-1);
        IVar6 = CalcTextColor(&pIVar7->Color);
        local_a8 = IVar2.x;
        fStack_a4 = IVar2.y;
        local_c8 = IVar3.x;
        fStack_c4 = IVar3.y;
        local_60.y = fStack_a4 * -0.5 + fStack_c4;
        local_60.x = local_a8 * -0.5 + local_c8;
        ImDrawList::AddText(this,&local_60,IVar6,buffer,(char *)0x0);
      }
      dVar10 = dVar13;
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = ImGui::GetColorU32(GetCurrentItem()->Color);
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col = CalcTextColor(item->Color);
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}